

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O3

size_t duckdb_je_tcache_salloc(tsdn_t *tsdn,void *ptr)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined8 uVar5;
  ulong uVar6;
  ulong uVar7;
  rtree_leaf_elm_t *prVar8;
  long lVar9;
  rtree_ctx_t *rtree_ctx;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_ctx_t rStack_198;
  
  rtree_ctx = &rStack_198;
  if (tsdn == (tsdn_t *)0x0) {
    duckdb_je_rtree_ctx_data_init(&rStack_198);
  }
  else {
    rtree_ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar6 = (ulong)ptr & 0xffffffffc0000000;
  uVar7 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  puVar1 = (ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar7);
  uVar7 = *(ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar7);
  if (uVar7 == uVar6) {
    prVar8 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar1[1]);
  }
  else if (rtree_ctx->l2_cache[0].leafkey == uVar6) {
    prVar8 = rtree_ctx->l2_cache[0].leaf;
    rtree_ctx->l2_cache[0].leafkey = uVar7;
    rtree_ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
    *puVar1 = uVar6;
    puVar1[1] = (ulong)prVar8;
    prVar8 = (rtree_leaf_elm_t *)
             ((long)&(prVar8->le_bits).repr + (ulong)((uint)ptr >> 9 & 0x1ffff8));
  }
  else {
    lVar9 = 0x118;
    do {
      if (*(ulong *)((long)rtree_ctx->cache + lVar9 + -8) == uVar6) {
        uVar4 = *(ulong *)((long)&rtree_ctx->cache[0].leafkey + lVar9);
        puVar2 = (undefined8 *)((long)rtree_ctx->cache + lVar9 + -0x18);
        uVar5 = puVar2[1];
        puVar3 = (undefined8 *)((long)rtree_ctx->cache + lVar9 + -8);
        *puVar3 = *puVar2;
        puVar3[1] = uVar5;
        *(ulong *)((long)rtree_ctx->cache + lVar9 + -0x18) = uVar7;
        *(ulong *)((long)(rtree_ctx->cache + -1) + lVar9) = puVar1[1];
        *puVar1 = uVar6;
        puVar1[1] = uVar4;
        prVar8 = (rtree_leaf_elm_t *)(((uint)ptr >> 9 & 0x1ffff8) + uVar4);
        goto LAB_01d84317;
      }
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x188);
    prVar8 = duckdb_je_rtree_leaf_elm_lookup_hard
                       (tsdn,&duckdb_je_arena_emap_global.rtree,rtree_ctx,(uintptr_t)ptr,true,false)
    ;
  }
LAB_01d84317:
  return duckdb_je_sz_index2size_tab[(ulong)(prVar8->le_bits).repr >> 0x30];
}

Assistant:

size_t
tcache_salloc(tsdn_t *tsdn, const void *ptr) {
	return arena_salloc(tsdn, ptr);
}